

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void compile_bracketpos_backtrackingpath(compiler_common *common,backtrack_common *current)

{
  sljit_compiler *compiler_00;
  jump_list *pjVar1;
  int iVar2;
  sljit_label *psVar3;
  sljit_jump *psVar4;
  sljit_jump *jump;
  int offset;
  sljit_compiler *compiler;
  backtrack_common *current_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  if (*(int *)((long)&current[1].prev + 4) < 0) {
    if ((*current->cc == 0x86) || (*current->cc == 0x8b)) {
      iVar2 = (uint)current->cc[2] * 2;
      sljit_emit_op1(compiler_00,0x20,1,0,0x8c,0);
      sljit_emit_op1(compiler_00,0x20,4,0,0x8c,8);
      sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->ovector_start + (long)iVar2 * 8,1,0);
      if (common->capture_last_ptr != 0) {
        sljit_emit_op1(compiler_00,0x20,1,0,0x8c,0x10);
      }
      sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->ovector_start + (long)(iVar2 + 1) * 8,4,0);
      if (common->capture_last_ptr != 0) {
        sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->capture_last_ptr,1,0);
      }
    }
    pjVar1 = current->topbacktracks;
    psVar3 = sljit_emit_label(compiler_00);
    set_jumps(pjVar1,psVar3);
    free_stack(common,*(int *)&current[1].nextbacktracks);
  }
  else {
    sljit_emit_op1(compiler_00,0x20,0xc,0,0x8e,(long)*(int *)&current[1].prev);
    psVar4 = sljit_emit_jump(compiler_00,0x19);
    add_jump(compiler_00,&common->revertframes,psVar4);
    sljit_emit_op2(compiler_00,0x60,0xc,0,0xc,0,0x40,
                   (long)(*(int *)((long)&current[1].prev + 4) + -1) << 3);
    if (current->topbacktracks != (jump_list *)0x0) {
      psVar4 = sljit_emit_jump(compiler_00,0x18);
      pjVar1 = current->topbacktracks;
      psVar3 = sljit_emit_label(compiler_00);
      set_jumps(pjVar1,psVar3);
      free_stack(common,*(int *)&current[1].nextbacktracks);
      psVar3 = sljit_emit_label(compiler_00);
      sljit_set_label(psVar4,psVar3);
    }
    sljit_emit_op1(compiler_00,0x20,0x8e,(long)*(int *)&current[1].prev,0x8c,
                   (long)((-1 - *(int *)((long)&current[1].prev + 4)) * 8));
  }
  return;
}

Assistant:

static SLJIT_INLINE void compile_bracketpos_backtrackingpath(compiler_common *common, struct backtrack_common *current)
{
DEFINE_COMPILER;
int offset;
struct sljit_jump *jump;

if (CURRENT_AS(bracketpos_backtrack)->framesize < 0)
  {
  if (*current->cc == OP_CBRAPOS || *current->cc == OP_SCBRAPOS)
    {
    offset = (GET2(current->cc, 1 + LINK_SIZE)) << 1;
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(STACK_TOP), STACK(1));
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset), TMP1, 0);
    if (common->capture_last_ptr != 0)
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(2));
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1), TMP2, 0);
    if (common->capture_last_ptr != 0)
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->capture_last_ptr, TMP1, 0);
    }
  set_jumps(current->topbacktracks, LABEL());
  free_stack(common, CURRENT_AS(bracketpos_backtrack)->stacksize);
  return;
  }

OP1(SLJIT_MOV, STACK_TOP, 0, SLJIT_MEM1(SLJIT_SP), CURRENT_AS(bracketpos_backtrack)->private_data_ptr);
add_jump(compiler, &common->revertframes, JUMP(SLJIT_FAST_CALL));
OP2(SLJIT_ADD, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, (CURRENT_AS(bracketpos_backtrack)->framesize - 1) * sizeof(sljit_sw));

if (current->topbacktracks)
  {
  jump = JUMP(SLJIT_JUMP);
  set_jumps(current->topbacktracks, LABEL());
  /* Drop the stack frame. */
  free_stack(common, CURRENT_AS(bracketpos_backtrack)->stacksize);
  JUMPHERE(jump);
  }
OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), CURRENT_AS(bracketpos_backtrack)->private_data_ptr, SLJIT_MEM1(STACK_TOP), STACK(-CURRENT_AS(bracketpos_backtrack)->framesize - 1));
}